

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O3

bool ON_ModelComponent::IsValidComponentNameFirstCodePoint
               (int length,wchar_t *candidate_component_name)

{
  ulong uVar1;
  wchar_t *pwVar2;
  bool bVar3;
  ulong uVar4;
  ON__UINT32 unicode_code_point;
  ON_UnicodeErrorParameters e;
  ON__UINT32 local_1c;
  ON_UnicodeErrorParameters local_18;
  
  if ((candidate_component_name == (wchar_t *)0x0) || (*candidate_component_name == L'\0')) {
    return false;
  }
  if (length < 0) {
    uVar4 = 0;
    do {
      uVar1 = uVar4 + 1;
      if (8 < uVar4) break;
      pwVar2 = candidate_component_name + uVar4;
      uVar4 = uVar1;
    } while (*pwVar2 != L'\0');
    length = (int)uVar1 + -1;
  }
  local_18._0_8_ = ON_UnicodeErrorParameters::FailOnErrors._0_8_;
  local_18.m_error_code_point = 0;
  local_1c = 0;
  ON_DecodeWideChar(candidate_component_name,length,&local_18,&local_1c);
  bVar3 = IsValidComponentNameFirstCodePoint(local_1c);
  return bVar3;
}

Assistant:

bool ON_ModelComponent::IsValidComponentNameFirstCodePoint(
  int length,
  const wchar_t* candidate_component_name
)
{
  if (nullptr == candidate_component_name || 0 == candidate_component_name[0])
    return false;

  if (length < 0)
  {
    for (length = 0; 0 != candidate_component_name[length]; length++)
    {
      if (length > 8)
        break; // 8 elements is plenty for all possible wchar_t encodings.
    }
  }

  ON_UnicodeErrorParameters e = ON_UnicodeErrorParameters::FailOnErrors;
  e.m_error_code_point = 0;
  ON__UINT32 unicode_code_point = 0;
  ON_DecodeWideChar(candidate_component_name, length, &e, &unicode_code_point);
  return ON_ModelComponent::IsValidComponentNameFirstCodePoint(unicode_code_point);
}